

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_map.cpp
# Opt level: O2

void __thiscall
CDoodadsMapper::Proceed(CDoodadsMapper *this,CLayerTiles *pLayer,int ConfigID,int Amount)

{
  CRuleSet *pCVar1;
  CTile *pCVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int i;
  long lVar7;
  CDoodadsMapper *this_00;
  CRule *pCVar8;
  long lVar9;
  bool bVar10;
  
  if (((-1 < ConfigID) && ((pLayer->super_CLayer).m_Readonly == false)) &&
     (ConfigID < (this->m_aRuleSets).num_elements)) {
    this_00 = this;
    AnalyzeGameLayer(this);
    pCVar1 = (this->m_aRuleSets).list;
    iVar3 = pCVar1[(uint)ConfigID].m_aRules.num_elements;
    if (iVar3 != 0) {
      uVar4 = pLayer->m_Height * pLayer->m_Width;
      uVar6 = 0;
      uVar5 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar5 = uVar6;
      }
      for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        pCVar2 = pLayer->m_pTiles;
        pCVar2[uVar6].m_Index = '\0';
        pCVar2[uVar6].m_Flags = '\0';
      }
      lVar9 = 0;
      for (lVar7 = 0; lVar7 < iVar3; lVar7 = lVar7 + 1) {
        pCVar8 = pCVar1[(uint)ConfigID].m_aRules.list;
        iVar3 = *(int *)((long)&pCVar8->m_Location + lVar9);
        pCVar8 = (CRule *)((long)&(pCVar8->m_Rect).field_0 + lVar9);
        if (iVar3 == 0) {
          if ((this->m_FloorIDs).num_elements < 1) {
            iVar3 = 0;
          }
          else {
            PlaceDoodads(this_00,pLayer,pCVar8,&this->m_FloorIDs,Amount,0);
            iVar3 = pCVar8->m_Location;
          }
        }
        if ((iVar3 == 1) && (0 < (this->m_CeilingIDs).num_elements)) {
          PlaceDoodads(this_00,pLayer,pCVar8,&this->m_CeilingIDs,Amount,0);
          iVar3 = pCVar8->m_Location;
        }
        if (iVar3 == 2) {
          if ((this->m_RightWallIDs).num_elements < 1) {
            bVar10 = true;
          }
          else {
            PlaceDoodads(this_00,pLayer,pCVar8,&this->m_RightWallIDs,Amount,0);
            bVar10 = pCVar8->m_Location == 2;
          }
          if ((bVar10) && (0 < (this->m_LeftWallIDs).num_elements)) {
            PlaceDoodads(this_00,pLayer,pCVar8,&this->m_LeftWallIDs,Amount,1);
          }
        }
        iVar3 = pCVar1[(uint)ConfigID].m_aRules.num_elements;
        lVar9 = lVar9 + 0x28;
      }
      (((this->super_IAutoMapper).m_pEditor)->m_Map).m_Modified = true;
    }
  }
  return;
}

Assistant:

void CDoodadsMapper::Proceed(CLayerTiles *pLayer, int ConfigID, int Amount)
{
	if(pLayer->m_Readonly || ConfigID < 0 || ConfigID >= m_aRuleSets.size())
		return;

	AnalyzeGameLayer();

	CRuleSet *pConf = &m_aRuleSets[ConfigID];

	if(!pConf->m_aRules.size())
		return;

	int MaxIndex = pLayer->m_Width*pLayer->m_Height;

	// clear tiles
	for(int i = 0 ; i < MaxIndex; i++)
	{
		pLayer->m_pTiles[i].m_Index = 0;
		pLayer->m_pTiles[i].m_Flags = 0;
	}

	// place doodads
	for(int i = 0 ; i < pConf->m_aRules.size(); i++)
	{
		CRule *pRule = &pConf->m_aRules[i];

		// floors
		if(pRule->m_Location == CRule::FLOOR && m_FloorIDs.size() > 0)
		{
			PlaceDoodads(pLayer, pRule, &m_FloorIDs, Amount);
		}

		// ceilings
		if(pRule->m_Location == CRule::CEILING && m_CeilingIDs.size() > 0)
		{
			PlaceDoodads(pLayer, pRule, &m_CeilingIDs, Amount);
		}

		// right walls
		if(pRule->m_Location == CRule::WALLS && m_RightWallIDs.size() > 0)
		{
			PlaceDoodads(pLayer, pRule, &m_RightWallIDs, Amount);
		}

		// left walls
		if(pRule->m_Location == CRule::WALLS && m_LeftWallIDs.size() > 0)
		{
			PlaceDoodads(pLayer, pRule, &m_LeftWallIDs, Amount, 1);
		}
	}

	m_pEditor->m_Map.m_Modified = true;
}